

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Binary * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Array*>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,Var **args_2,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_3,BinaryOp *args_4,Array **args_5)

{
  Binary *this_00;
  AST *in_RCX;
  Binary *in_R9;
  Binary *r;
  Fodder *in_stack_ffffffffffffffb0;
  AST *in_stack_ffffffffffffffb8;
  Fodder *in_stack_ffffffffffffffc0;
  LocationRange *in_stack_ffffffffffffffc8;
  
  this_00 = (Binary *)operator_new(0xb0);
  Binary::Binary(in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                 ,in_stack_ffffffffffffffb0,(BinaryOp)((ulong)this_00 >> 0x20),in_RCX);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }